

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

qsizetype QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_*>,_const_QString_&>,_char>,_const_QString_&>_>
          ::size(type *p)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  
  lVar1 = (p->a).a.a.a.b.d.size;
  __s = (p->a).a.a.b;
  if (__s == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(__s);
  }
  return (p->b->d).size + lVar1 + sVar2 + (((p->a).a.b)->d).size + 3;
}

Assistant:

static qsizetype size(const type &p)
    {
        return QConcatenableEx<A>::size(p.a) + QConcatenableEx<B>::size(p.b);
    }